

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::SummaryTest_sample_sum_Test::TestBody(SummaryTest_sample_sum_Test *this)

{
  pointer *__ptr;
  char *message;
  initializer_list<prometheus::detail::CKMSQuantiles::Quantile> __l;
  AssertionResult gtest_ar;
  Summary s;
  Summary summary;
  ClientMetric metric;
  Message local_168;
  AssertHelper local_160;
  allocator_type local_158 [8];
  undefined8 *local_150;
  undefined1 local_148 [40];
  Summary local_120;
  ClientMetric local_98;
  
  detail::CKMSQuantiles::Quantile::Quantile((Quantile *)&local_98,0.5,0.05);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_98;
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::vector((vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
            *)local_148,__l,local_158);
  Summary::Summary(&local_120,(Quantiles *)local_148,(milliseconds)0xea60,5);
  if ((pointer)local_148._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._0_8_);
  }
  Summary::Observe(&local_120,0.0);
  Summary::Observe(&local_120,1.0);
  Summary::Observe(&local_120,101.0);
  Summary::Collect(&local_98,&local_120);
  local_148._0_8_ = local_98.summary.sample_count;
  local_148._8_8_ = local_98.summary.sample_sum;
  std::
  vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>::
  vector((vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
          *)(local_148 + 0x10),&local_98.summary.quantile);
  local_168.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x66;
  testing::internal::CmpHelperEQ<double,int>
            ((internal *)local_158,"s.sample_sum","102",(double *)(local_148 + 8),(int *)&local_168)
  ;
  if (local_158[0] == (allocator_type)0x0) {
    testing::Message::Message(&local_168);
    if (local_150 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_150;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/summary_test.cc"
               ,0x26,message);
    testing::internal::AssertHelper::operator=(&local_160,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((long *)CONCAT44(local_168.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_168.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_168.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_168.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_150 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_150 != local_150 + 2) {
      operator_delete((undefined8 *)*local_150);
    }
    operator_delete(local_150);
  }
  if ((pointer)local_148._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._16_8_);
  }
  if (local_98.histogram.bucket.
      super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.histogram.bucket.
                    super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.summary.quantile.
      super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.summary.quantile.
                    super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>::
  ~vector(&local_98.label);
  std::vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
  ::~vector(&local_120.quantile_values_.ckms_quantiles_);
  if (local_120.quantiles_.
      super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.quantiles_.
                    super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(SummaryTest, sample_sum) {
  Summary summary{Summary::Quantiles{{0.5, 0.05}}};
  summary.Observe(0);
  summary.Observe(1);
  summary.Observe(101);
  auto metric = summary.Collect();
  auto s = metric.summary;
  EXPECT_EQ(s.sample_sum, 102);
}